

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O0

void __thiscall
tonk::SenderBandwidthControl::Initialize
          (SenderBandwidthControl *this,Dependencies *deps,Parameters *params)

{
  uint64_t nowUsec_00;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  uint64_t nowUsec;
  
  *in_RDI = *in_RSI;
  in_RDI[1] = in_RSI[1];
  in_RDI[2] = *in_RDX;
  *(undefined4 *)((long)in_RDI + 0x54) = 0x19000;
  if ((*(byte *)(in_RDI + 2) & 1) == 0) {
    *(undefined4 *)(in_RDI + 9) = 13000;
  }
  else {
    *(undefined4 *)(in_RDI + 9) = *(undefined4 *)((long)in_RDI + 0x14);
  }
  nowUsec_00 = siamese::GetTimeUsec();
  Timer::SetTimeoutUsec((Timer *)(in_RDI + 4),100000,Restart);
  Timer::Start((Timer *)(in_RDI + 4),nowUsec_00);
  return;
}

Assistant:

void SenderBandwidthControl::Initialize(
    const Dependencies& deps,
    const Parameters& params)
{
    Deps = deps;
    Params = params;

    // Set initial FEC rate
    static const float kInitialFECRate = 0.01f;
    RecoverySendCost = static_cast<int>(kReliableRewardTokens / kInitialFECRate);

    if (Params.IgnoreReceiverFeedback) {
        Shape.AppBPS = Params.MaximumBPS;
    }
    else {
        Shape.AppBPS = protocol::kBandwidthBurstTokenLimit;
    }

    // Set initial recovery timer
    const uint64_t nowUsec = siamese::GetTimeUsec();
    RecoveryTimer.SetTimeoutUsec(protocol::kInitialOWDUsec, Timer::Behavior::Restart);
    RecoveryTimer.Start(nowUsec);
}